

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::PerspectiveCameraNode> *camera,ssize_t id)

{
  ostream *poVar1;
  long in_RDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"<PerspectiveCamera ");
  poVar1 = std::operator<<(poVar1,"id=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"name=\"");
  poVar1 = std::operator<<(poVar1,(string *)(*in_RSI + 0x30));
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"from=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x70));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x74));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x78));
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"to=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x80));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x84));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x88));
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"up=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x90));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x94));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0x98));
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"fov=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(*in_RSI + 0xa0));
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"/>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::PerspectiveCameraNode> camera, ssize_t id)
  {
    tab(); 
    xml << "<PerspectiveCamera " <<
      "id=\"" << id << "\" " << 
      "name=\"" << camera->name << "\" " <<
      "from=\"" << camera->data.from.x << " " << camera->data.from.y << " " << camera->data.from.z << "\" " <<
      "to=\""   << camera->data.to.x   << " " << camera->data.to.y   << " " << camera->data.to.z << "\" " <<
      "up=\""   << camera->data.up.x   << " " << camera->data.up.y   << " " << camera->data.up.z << "\" " <<
      "fov=\""  << camera->data.fov << "\" " << "/>" << std::endl;
  }